

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg.cpp
# Opt level: O0

bool __thiscall zmq::msg_t::rm_refs(msg_t *this,int refs_)

{
  bool bVar1;
  integer_t in_ESI;
  integer_t __fd;
  msg_t *in_RDI;
  bool local_1;
  
  __fd = in_ESI;
  if ((int)in_ESI < 0) {
    __fd = 0x32b5a3;
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","refs_ >= 0",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/msg.cpp"
            ,0x265);
    fflush(_stderr);
    zmq_abort((char *)0x2b8aae);
  }
  if ((in_RDI->_u).base.metadata != (metadata_t *)0x0) {
    __fd = 0x32b5a3;
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_u.base.metadata == NULL",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/msg.cpp"
            ,0x268);
    fflush(_stderr);
    zmq_abort((char *)0x2b8b0d);
  }
  if (in_ESI == 0) {
    local_1 = true;
  }
  else if ((((in_RDI->_u).base.type == 'i') || ((in_RDI->_u).base.type == 'f')) &&
          (((in_RDI->_u).base.flags & 0x80) != 0)) {
    if (((in_RDI->_u).base.type != 'f') ||
       (bVar1 = atomic_counter_t::sub(&((in_RDI->_u).lmsg.content)->refcnt,in_ESI), bVar1)) {
      bVar1 = is_zcmsg(in_RDI);
      if ((!bVar1) ||
         (bVar1 = atomic_counter_t::sub(&((in_RDI->_u).lmsg.content)->refcnt,in_ESI), bVar1)) {
        local_1 = true;
      }
      else {
        if (((in_RDI->_u).lmsg.content)->ffn != (undefined1 *)0x0) {
          (*(code *)((in_RDI->_u).lmsg.content)->ffn)
                    (((in_RDI->_u).lmsg.content)->data,((in_RDI->_u).lmsg.content)->hint);
        }
        local_1 = false;
      }
    }
    else {
      if (((in_RDI->_u).lmsg.content)->ffn != (undefined1 *)0x0) {
        (*(code *)((in_RDI->_u).lmsg.content)->ffn)
                  (((in_RDI->_u).lmsg.content)->data,((in_RDI->_u).lmsg.content)->hint);
      }
      free((in_RDI->_u).cmsg.data);
      local_1 = false;
    }
  }
  else {
    close(in_RDI,__fd);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool zmq::msg_t::rm_refs (int refs_)
{
    zmq_assert (refs_ >= 0);

    //  Operation not supported for messages with metadata.
    zmq_assert (_u.base.metadata == NULL);

    //  No copies required.
    if (!refs_)
        return true;

    //  If there's only one reference close the message.
    if ((_u.base.type != type_zclmsg && _u.base.type != type_lmsg)
        || !(_u.base.flags & msg_t::shared)) {
        close ();
        return false;
    }

    //  The only message type that needs special care are long and zcopy messages.
    if (_u.base.type == type_lmsg && !_u.lmsg.content->refcnt.sub (refs_)) {
        //  We used "placement new" operator to initialize the reference
        //  counter so we call the destructor explicitly now.
        _u.lmsg.content->refcnt.~atomic_counter_t ();

        if (_u.lmsg.content->ffn)
            _u.lmsg.content->ffn (_u.lmsg.content->data, _u.lmsg.content->hint);
        free (_u.lmsg.content);

        return false;
    }

    if (is_zcmsg () && !_u.zclmsg.content->refcnt.sub (refs_)) {
        // storage for rfcnt is provided externally
        if (_u.zclmsg.content->ffn) {
            _u.zclmsg.content->ffn (_u.zclmsg.content->data,
                                    _u.zclmsg.content->hint);
        }

        return false;
    }

    return true;
}